

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O2

void __thiscall CMapImages::CMapImages(CMapImages *this)

{
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CComponent_002072f0;
  memset(this->m_Info,0xff,0x100);
  memset(this->m_Info + 1,0xff,0x100);
  this->m_Info[0].m_Count = 0;
  *(undefined8 *)&this->m_Info[1].m_Count = 0xffffffff00000000;
  this->m_EasterIsLoaded = false;
  return;
}

Assistant:

CMapImages::CMapImages()
{
	m_Info[MAP_TYPE_GAME].m_Count = 0;
	m_Info[MAP_TYPE_MENU].m_Count = 0;

	m_EasterIsLoaded = false;
}